

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

void fdb_file_handle_init(fdb_file_handle *fhandle,fdb_kvs_handle *root)

{
  void *pvVar1;
  long in_RSI;
  long *in_RDI;
  
  *in_RDI = in_RSI;
  in_RDI[3] = 0;
  *(long **)(in_RSI + 0x28) = in_RDI;
  pvVar1 = calloc(1,0x10);
  in_RDI[1] = (long)pvVar1;
  in_RDI[2] = 0;
  pthread_spin_init((pthread_spinlock_t *)(in_RDI + 4),1);
  return;
}

Assistant:

void fdb_file_handle_init(fdb_file_handle *fhandle,
                           fdb_kvs_handle *root)
{
    fhandle->root = root;
    fhandle->flags = 0x0;
    root->fhandle = fhandle;
    fhandle->handles = (struct list*)calloc(1, sizeof(struct list));
    fhandle->cmp_func_list = NULL;
    spin_init(&fhandle->lock);
}